

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

unsigned_long_long
doctest::anon_unknown_15::hash
          (vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *sigs)

{
  SubcaseSignature *pSVar1;
  unsigned_long_long uVar2;
  SubcaseSignature *sig;
  SubcaseSignature *sig_00;
  unsigned_long_long uVar3;
  
  pSVar1 = (sigs->
           super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (sig_00 = (sigs->
                super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                )._M_impl.super__Vector_impl_data._M_start; sig_00 != pSVar1; sig_00 = sig_00 + 1) {
    uVar2 = hash(sig_00);
    uVar3 = uVar3 * 0x20 + uVar2;
  }
  return uVar3;
}

Assistant:

void filloss(std::ostream* stream, const T (&in)[N]) { // NOLINT(*-avoid-c-arrays)
        // T[N], T(&)[N], T(&&)[N] have same behaviour.
        // Hence remove reference.
        filloss<typename types::remove_reference<decltype(in)>::type>(stream, in);
    }